

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O1

void __thiscall CInput::UpdateJoystickState(CInput *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  uint uVar11;
  undefined4 extraout_var;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar26;
  int iVar27;
  undefined1 auVar24 [16];
  int iVar28;
  undefined1 auVar25 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar47;
  int iVar50;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar51 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float local_78;
  long *plVar12;
  
  iVar9 = (*(this->super_IEngineInput).super_IInput.super_IInterface._vptr_IInterface[7])();
  plVar12 = (long *)CONCAT44(extraout_var,iVar9);
  if (plVar12 != (long *)0x0) {
    iVar9 = this->m_pConfig->m_JoystickTolerance;
    iVar10 = (**(code **)(*plVar12 + 0x10))(plVar12);
    if (0 < iVar10) {
      fVar19 = (float)iVar9 / 50.0;
      local_78 = -fVar19;
      uVar17 = 0;
      do {
        fVar20 = (float)(**(code **)(*plVar12 + 0x30))(plVar12,uVar17 & 0xffffffff);
        this->m_aInputState[uVar17 * 2 + 0x1c2] = fVar20 <= local_78;
        this->m_aInputState[uVar17 * 2 + 0x1c3] = fVar19 <= fVar20;
        uVar17 = uVar17 + 1;
        iVar9 = (**(code **)(*plVar12 + 0x10))(plVar12);
      } while ((long)uVar17 < (long)iVar9);
    }
    iVar9 = (**(code **)(*plVar12 + 0x28))(plVar12);
    if (0 < iVar9) {
      uVar17 = 0x1b0;
      iVar9 = 0x37;
      uVar18 = 0;
      do {
        uVar16 = (ulong)(uint)(iVar9 * 8) + 1;
        if (uVar16 < uVar17 + 2) {
          uVar16 = uVar17 + 2;
        }
        uVar11 = (**(code **)(*plVar12 + 0x38))(plVar12,uVar18 & 0xffffffff);
        auVar8 = _DAT_001d9d10;
        auVar7 = _DAT_001d9d00;
        auVar6 = _DAT_001d9cf0;
        auVar5 = _DAT_001d9ce0;
        auVar4 = _DAT_001d9cd0;
        auVar3 = _DAT_001d9cc0;
        auVar2 = _DAT_001d9cb0;
        auVar1 = _DAT_001d6f30;
        uVar15 = (ulong)((int)uVar18 * 8 + 0x1b8) + 1;
        if (uVar15 < (uVar17 | 2)) {
          uVar15 = uVar17 | 2;
        }
        lVar13 = uVar11 - uVar17;
        lVar14 = uVar15 + ~uVar17 + -1;
        auVar21._8_4_ = (int)lVar14;
        auVar21._0_8_ = lVar14;
        auVar21._12_4_ = (int)((ulong)lVar14 >> 0x20);
        uVar15 = 0;
        do {
          auVar22._8_4_ = (int)uVar15;
          auVar22._0_8_ = uVar15;
          auVar22._12_4_ = (int)(uVar15 >> 0x20);
          auVar24 = auVar21 ^ _DAT_001d6390;
          auVar29 = (auVar22 | auVar1) ^ _DAT_001d6390;
          iVar10 = auVar24._0_4_;
          iVar47 = -(uint)(iVar10 < auVar29._0_4_);
          iVar26 = auVar24._4_4_;
          auVar30._4_4_ = -(uint)(iVar26 < auVar29._4_4_);
          iVar27 = auVar24._8_4_;
          iVar50 = -(uint)(iVar27 < auVar29._8_4_);
          iVar28 = auVar24._12_4_;
          auVar30._12_4_ = -(uint)(iVar28 < auVar29._12_4_);
          auVar40._4_4_ = iVar47;
          auVar40._0_4_ = iVar47;
          auVar40._8_4_ = iVar50;
          auVar40._12_4_ = iVar50;
          auVar51 = pshuflw(in_XMM6,auVar40,0xe8);
          auVar24._4_4_ = -(uint)(auVar29._4_4_ == iVar26);
          auVar24._12_4_ = -(uint)(auVar29._12_4_ == iVar28);
          auVar24._0_4_ = auVar24._4_4_;
          auVar24._8_4_ = auVar24._12_4_;
          auVar52 = pshuflw(in_XMM7,auVar24,0xe8);
          auVar30._0_4_ = auVar30._4_4_;
          auVar30._8_4_ = auVar30._12_4_;
          auVar29 = pshuflw(auVar51,auVar30,0xe8);
          auVar53._8_4_ = 0xffffffff;
          auVar53._0_8_ = 0xffffffffffffffff;
          auVar53._12_4_ = 0xffffffff;
          auVar29 = (auVar29 | auVar52 & auVar51) ^ auVar53;
          auVar29 = packssdw(auVar29,auVar29);
          if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            this->m_aInputState[uVar15 + uVar17 + 2] = lVar13 - 2U == uVar15;
          }
          auVar30 = auVar24 & auVar40 | auVar30;
          auVar24 = packssdw(auVar30,auVar30);
          auVar24 = packssdw(auVar24 ^ auVar53,auVar24 ^ auVar53);
          auVar24 = packsswb(auVar24,auVar24);
          if ((auVar24._0_4_ >> 8 & 1) != 0) {
            this->m_aInputState[uVar15 + uVar17 + 3] = lVar13 - 3U == uVar15;
          }
          auVar24 = (auVar22 | auVar8) ^ _DAT_001d6390;
          iVar47 = -(uint)(iVar10 < auVar24._0_4_);
          auVar52._4_4_ = -(uint)(iVar26 < auVar24._4_4_);
          iVar50 = -(uint)(iVar27 < auVar24._8_4_);
          auVar52._12_4_ = -(uint)(iVar28 < auVar24._12_4_);
          auVar29._4_4_ = iVar47;
          auVar29._0_4_ = iVar47;
          auVar29._8_4_ = iVar50;
          auVar29._12_4_ = iVar50;
          auVar51._4_4_ = -(uint)(auVar24._4_4_ == iVar26);
          auVar51._12_4_ = -(uint)(auVar24._12_4_ == iVar28);
          auVar51._0_4_ = auVar51._4_4_;
          auVar51._8_4_ = auVar51._12_4_;
          auVar52._0_4_ = auVar52._4_4_;
          auVar52._8_4_ = auVar52._12_4_;
          auVar24 = auVar51 & auVar29 | auVar52;
          auVar24 = packssdw(auVar24,auVar24);
          auVar24 = packssdw(auVar24 ^ auVar53,auVar24 ^ auVar53);
          auVar24 = packsswb(auVar24,auVar24);
          if ((auVar24._0_4_ >> 0x10 & 1) != 0) {
            this->m_aInputState[uVar15 + uVar17 + 4] = lVar13 - 4U == uVar15;
          }
          auVar29 = pshufhw(auVar29,auVar29,0x84);
          auVar40 = pshufhw(auVar51,auVar51,0x84);
          auVar30 = pshufhw(auVar29,auVar52,0x84);
          auVar29 = (auVar30 | auVar40 & auVar29) ^ auVar53;
          auVar29 = packssdw(auVar29,auVar29);
          auVar29 = packsswb(auVar29,auVar29);
          if ((auVar29._0_4_ >> 0x18 & 1) != 0) {
            this->m_aInputState[uVar15 + uVar17 + 5] = lVar13 - 5U == uVar15;
          }
          auVar29 = (auVar22 | auVar7) ^ _DAT_001d6390;
          iVar47 = -(uint)(iVar10 < auVar29._0_4_);
          auVar32._4_4_ = -(uint)(iVar26 < auVar29._4_4_);
          iVar50 = -(uint)(iVar27 < auVar29._8_4_);
          auVar32._12_4_ = -(uint)(iVar28 < auVar29._12_4_);
          auVar41._4_4_ = iVar47;
          auVar41._0_4_ = iVar47;
          auVar41._8_4_ = iVar50;
          auVar41._12_4_ = iVar50;
          auVar24 = pshuflw(auVar24,auVar41,0xe8);
          auVar31._4_4_ = -(uint)(auVar29._4_4_ == iVar26);
          auVar31._12_4_ = -(uint)(auVar29._12_4_ == iVar28);
          auVar31._0_4_ = auVar31._4_4_;
          auVar31._8_4_ = auVar31._12_4_;
          auVar30 = pshuflw(auVar53,auVar31,0xe8);
          auVar32._0_4_ = auVar32._4_4_;
          auVar32._8_4_ = auVar32._12_4_;
          auVar29 = pshuflw(auVar24,auVar32,0xe8);
          auVar54._8_4_ = 0xffffffff;
          auVar54._0_8_ = 0xffffffffffffffff;
          auVar54._12_4_ = 0xffffffff;
          auVar24 = (auVar29 | auVar30 & auVar24) ^ auVar54;
          auVar24 = packssdw(auVar24,auVar24);
          auVar24 = packsswb(auVar24,auVar24);
          if ((auVar24 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            this->m_aInputState[uVar15 + uVar17 + 6] = lVar13 - 6U == uVar15;
          }
          auVar32 = auVar31 & auVar41 | auVar32;
          auVar24 = packssdw(auVar32,auVar32);
          auVar24 = packssdw(auVar24 ^ auVar54,auVar24 ^ auVar54);
          auVar24 = packsswb(auVar24,auVar24);
          if ((auVar24._4_2_ >> 8 & 1) != 0) {
            this->m_aInputState[uVar15 + uVar17 + 7] = lVar13 - 7U == uVar15;
          }
          auVar24 = (auVar22 | auVar6) ^ _DAT_001d6390;
          iVar47 = -(uint)(iVar10 < auVar24._0_4_);
          auVar48._4_4_ = -(uint)(iVar26 < auVar24._4_4_);
          iVar50 = -(uint)(iVar27 < auVar24._8_4_);
          auVar48._12_4_ = -(uint)(iVar28 < auVar24._12_4_);
          auVar33._4_4_ = iVar47;
          auVar33._0_4_ = iVar47;
          auVar33._8_4_ = iVar50;
          auVar33._12_4_ = iVar50;
          auVar42._4_4_ = -(uint)(auVar24._4_4_ == iVar26);
          auVar42._12_4_ = -(uint)(auVar24._12_4_ == iVar28);
          auVar42._0_4_ = auVar42._4_4_;
          auVar42._8_4_ = auVar42._12_4_;
          auVar48._0_4_ = auVar48._4_4_;
          auVar48._8_4_ = auVar48._12_4_;
          auVar24 = auVar42 & auVar33 | auVar48;
          auVar24 = packssdw(auVar24,auVar24);
          auVar24 = packssdw(auVar24 ^ auVar54,auVar24 ^ auVar54);
          auVar24 = packsswb(auVar24,auVar24);
          if ((auVar24 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            this->m_aInputState[uVar15 + uVar17 + 8] = lVar13 - 8U == uVar15;
          }
          auVar29 = pshufhw(auVar33,auVar33,0x84);
          auVar40 = pshufhw(auVar42,auVar42,0x84);
          auVar30 = pshufhw(auVar29,auVar48,0x84);
          auVar29 = (auVar30 | auVar40 & auVar29) ^ auVar54;
          auVar29 = packssdw(auVar29,auVar29);
          auVar29 = packsswb(auVar29,auVar29);
          if ((auVar29._6_2_ >> 8 & 1) != 0) {
            this->m_aInputState[uVar15 + uVar17 + 9] = lVar13 - 9U == uVar15;
          }
          auVar29 = (auVar22 | auVar5) ^ _DAT_001d6390;
          iVar47 = -(uint)(iVar10 < auVar29._0_4_);
          auVar35._4_4_ = -(uint)(iVar26 < auVar29._4_4_);
          iVar50 = -(uint)(iVar27 < auVar29._8_4_);
          auVar35._12_4_ = -(uint)(iVar28 < auVar29._12_4_);
          auVar43._4_4_ = iVar47;
          auVar43._0_4_ = iVar47;
          auVar43._8_4_ = iVar50;
          auVar43._12_4_ = iVar50;
          auVar24 = pshuflw(auVar24,auVar43,0xe8);
          auVar34._4_4_ = -(uint)(auVar29._4_4_ == iVar26);
          auVar34._12_4_ = -(uint)(auVar29._12_4_ == iVar28);
          auVar34._0_4_ = auVar34._4_4_;
          auVar34._8_4_ = auVar34._12_4_;
          auVar30 = pshuflw(auVar54,auVar34,0xe8);
          auVar35._0_4_ = auVar35._4_4_;
          auVar35._8_4_ = auVar35._12_4_;
          auVar29 = pshuflw(auVar24,auVar35,0xe8);
          auVar55._8_4_ = 0xffffffff;
          auVar55._0_8_ = 0xffffffffffffffff;
          auVar55._12_4_ = 0xffffffff;
          auVar24 = (auVar29 | auVar30 & auVar24) ^ auVar55;
          auVar24 = packssdw(auVar24,auVar24);
          auVar24 = packsswb(auVar24,auVar24);
          if ((auVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            this->m_aInputState[uVar15 + uVar17 + 10] = lVar13 - 10U == uVar15;
          }
          auVar35 = auVar34 & auVar43 | auVar35;
          auVar24 = packssdw(auVar35,auVar35);
          auVar24 = packssdw(auVar24 ^ auVar55,auVar24 ^ auVar55);
          auVar24 = packsswb(auVar24,auVar24);
          if ((auVar24._8_2_ >> 8 & 1) != 0) {
            this->m_aInputState[uVar15 + uVar17 + 0xb] = lVar13 - 0xbU == uVar15;
          }
          auVar24 = (auVar22 | auVar4) ^ _DAT_001d6390;
          iVar47 = -(uint)(iVar10 < auVar24._0_4_);
          auVar49._4_4_ = -(uint)(iVar26 < auVar24._4_4_);
          iVar50 = -(uint)(iVar27 < auVar24._8_4_);
          auVar49._12_4_ = -(uint)(iVar28 < auVar24._12_4_);
          auVar36._4_4_ = iVar47;
          auVar36._0_4_ = iVar47;
          auVar36._8_4_ = iVar50;
          auVar36._12_4_ = iVar50;
          auVar44._4_4_ = -(uint)(auVar24._4_4_ == iVar26);
          auVar44._12_4_ = -(uint)(auVar24._12_4_ == iVar28);
          auVar44._0_4_ = auVar44._4_4_;
          auVar44._8_4_ = auVar44._12_4_;
          auVar49._0_4_ = auVar49._4_4_;
          auVar49._8_4_ = auVar49._12_4_;
          auVar24 = auVar44 & auVar36 | auVar49;
          auVar24 = packssdw(auVar24,auVar24);
          auVar24 = packssdw(auVar24 ^ auVar55,auVar24 ^ auVar55);
          auVar24 = packsswb(auVar24,auVar24);
          if ((auVar24 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            this->m_aInputState[uVar15 + uVar17 + 0xc] = lVar13 - 0xcU == uVar15;
          }
          auVar29 = pshufhw(auVar36,auVar36,0x84);
          auVar40 = pshufhw(auVar44,auVar44,0x84);
          auVar30 = pshufhw(auVar29,auVar49,0x84);
          auVar29 = (auVar30 | auVar40 & auVar29) ^ auVar55;
          auVar29 = packssdw(auVar29,auVar29);
          auVar29 = packsswb(auVar29,auVar29);
          if ((auVar29._10_2_ >> 8 & 1) != 0) {
            this->m_aInputState[uVar15 + uVar17 + 0xd] = lVar13 - 0xdU == uVar15;
          }
          auVar29 = (auVar22 | auVar3) ^ _DAT_001d6390;
          iVar47 = -(uint)(iVar10 < auVar29._0_4_);
          auVar38._4_4_ = -(uint)(iVar26 < auVar29._4_4_);
          iVar50 = -(uint)(iVar27 < auVar29._8_4_);
          auVar38._12_4_ = -(uint)(iVar28 < auVar29._12_4_);
          auVar45._4_4_ = iVar47;
          auVar45._0_4_ = iVar47;
          auVar45._8_4_ = iVar50;
          auVar45._12_4_ = iVar50;
          auVar24 = pshuflw(auVar24,auVar45,0xe8);
          auVar37._4_4_ = -(uint)(auVar29._4_4_ == iVar26);
          auVar37._12_4_ = -(uint)(auVar29._12_4_ == iVar28);
          auVar37._0_4_ = auVar37._4_4_;
          auVar37._8_4_ = auVar37._12_4_;
          auVar30 = pshuflw(auVar55,auVar37,0xe8);
          auVar38._0_4_ = auVar38._4_4_;
          auVar38._8_4_ = auVar38._12_4_;
          auVar29 = pshuflw(auVar24,auVar38,0xe8);
          in_XMM7._8_4_ = 0xffffffff;
          in_XMM7._0_8_ = 0xffffffffffffffff;
          in_XMM7._12_4_ = 0xffffffff;
          auVar24 = (auVar29 | auVar30 & auVar24) ^ in_XMM7;
          auVar24 = packssdw(auVar24,auVar24);
          in_XMM6 = packsswb(auVar24,auVar24);
          if ((in_XMM6 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            this->m_aInputState[uVar15 + uVar17 + 0xe] = lVar13 - 0xeU == uVar15;
          }
          auVar38 = auVar37 & auVar45 | auVar38;
          auVar24 = packssdw(auVar38,auVar38);
          auVar24 = packssdw(auVar24 ^ in_XMM7,auVar24 ^ in_XMM7);
          auVar24 = packsswb(auVar24,auVar24);
          if ((auVar24._12_2_ >> 8 & 1) != 0) {
            this->m_aInputState[uVar15 + uVar17 + 0xf] = lVar13 - 0xfU == uVar15;
          }
          auVar22 = (auVar22 | auVar2) ^ _DAT_001d6390;
          auVar46._0_4_ = -(uint)(iVar10 < auVar22._0_4_);
          auVar46._4_4_ = -(uint)(iVar26 < auVar22._4_4_);
          auVar46._8_4_ = -(uint)(iVar27 < auVar22._8_4_);
          auVar46._12_4_ = -(uint)(iVar28 < auVar22._12_4_);
          auVar39._4_4_ = auVar46._0_4_;
          auVar39._0_4_ = auVar46._0_4_;
          auVar39._8_4_ = auVar46._8_4_;
          auVar39._12_4_ = auVar46._8_4_;
          auVar23._4_4_ = -(uint)(auVar22._4_4_ == iVar26);
          auVar23._12_4_ = -(uint)(auVar22._12_4_ == iVar28);
          auVar23._0_4_ = auVar23._4_4_;
          auVar23._8_4_ = auVar23._12_4_;
          auVar25._4_4_ = auVar46._4_4_;
          auVar25._0_4_ = auVar46._4_4_;
          auVar25._8_4_ = auVar46._12_4_;
          auVar25._12_4_ = auVar46._12_4_;
          auVar22 = packssdw(auVar46,auVar23 & auVar39 | auVar25);
          auVar22 = packssdw(auVar22 ^ in_XMM7,auVar22 ^ in_XMM7);
          auVar22 = packsswb(auVar22,auVar22);
          if ((auVar22 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            this->m_aInputState[uVar15 + uVar17 + 0x10] = lVar13 - 0x10U == uVar15;
          }
          auVar29 = pshufhw(auVar39,auVar39,0x84);
          auVar22 = pshufhw(auVar23,auVar23,0x84);
          auVar24 = pshufhw(auVar25,auVar25,0x84);
          auVar22 = packssdw(auVar22 & auVar29,(auVar24 | auVar22 & auVar29) ^ in_XMM7);
          auVar22 = packsswb(auVar22,auVar22);
          if ((auVar22._14_2_ >> 8 & 1) != 0) {
            this->m_aInputState[uVar15 + uVar17 + 0x11] = lVar13 - 0x11U == uVar15;
          }
          uVar15 = uVar15 + 0x10;
        } while (((uVar16 - uVar17) + 0xe & 0xfffffffffffffff0) != uVar15);
        uVar18 = uVar18 + 1;
        iVar10 = (**(code **)(*plVar12 + 0x28))(plVar12);
        uVar17 = (ulong)((int)uVar17 + 8);
        iVar9 = iVar9 + 1;
      } while ((long)uVar18 < (long)iVar10);
    }
  }
  return;
}

Assistant:

void CInput::UpdateJoystickState()
{
	IJoystick *pJoystick = GetActiveJoystick();
	if(!pJoystick)
		return;

	const float DeadZone = GetJoystickDeadzone();
	for(int Axis = 0; Axis < pJoystick->GetNumAxes(); Axis++)
	{
		const float Value = pJoystick->GetAxisValue(Axis);
		const int LeftKey = KEY_JOY_AXIS_0_LEFT + 2 * Axis;
		const int RightKey = LeftKey + 1;
		m_aInputState[LeftKey] = Value <= -DeadZone;
		m_aInputState[RightKey] = Value >= DeadZone;
	}

	for(int Hat = 0; Hat < pJoystick->GetNumHats(); Hat++)
	{
		const int HatState = pJoystick->GetHatValue(Hat);
		for(int Key = KEY_JOY_HAT0_LEFTUP + Hat * NUM_JOYSTICK_BUTTONS_PER_HAT; Key <= KEY_JOY_HAT0_RIGHTDOWN + Hat * NUM_JOYSTICK_BUTTONS_PER_HAT; Key++)
			m_aInputState[Key] = Key == HatState;
	}
}